

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolledFile.cpp
# Opt level: O1

void __thiscall PolledFile::~PolledFile(PolledFile *this)

{
  Impl *__ptr;
  
  __ptr = (this->impl_)._M_t.
          super___uniq_ptr_impl<PolledFile::Impl,_std::default_delete<PolledFile::Impl>_>._M_t.
          super__Tuple_impl<0UL,_PolledFile::Impl_*,_std::default_delete<PolledFile::Impl>_>.
          super__Head_base<0UL,_PolledFile::Impl_*,_false>._M_head_impl;
  if (__ptr != (Impl *)0x0) {
    std::default_delete<PolledFile::Impl>::operator()
              ((default_delete<PolledFile::Impl> *)&this->impl_,__ptr);
  }
  (this->impl_)._M_t.super___uniq_ptr_impl<PolledFile::Impl,_std::default_delete<PolledFile::Impl>_>
  ._M_t.super__Tuple_impl<0UL,_PolledFile::Impl_*,_std::default_delete<PolledFile::Impl>_>.
  super__Head_base<0UL,_PolledFile::Impl_*,_false>._M_head_impl = (Impl *)0x0;
  return;
}

Assistant:

PolledFile::~PolledFile() {}